

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  Test *pTVar8;
  byte bVar9;
  int i;
  uint uVar10;
  long lVar11;
  bool *pbVar12;
  allocator<char> local_a1;
  uint local_a0;
  int local_9c;
  string local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_50;
  
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_98.field_2._8_8_ = 1;
  local_98._M_dataplus._M_p = "gtest_filter";
  local_98._M_string_length = 1;
  pcVar4 = "*";
  while (iVar3 = getopt_long(argc,argv,"h",&local_98,0), pcVar1 = _optarg, iVar3 == 1) {
    pcVar4 = strchr(_optarg,0x3f);
    if ((pcVar4 != (char *)0x0) ||
       (pcVar5 = strchr(pcVar1,0x3a), pcVar4 = pcVar1, pcVar5 != (char *)0x0)) goto LAB_0016fc8b;
  }
  if (iVar3 == -1) {
    lVar11 = 0;
    local_9c = ntests;
    uVar6 = 0;
    if (0 < ntests) {
      uVar6 = (ulong)(uint)ntests;
    }
    local_a0 = 0;
    for (; uVar6 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
      pcVar1 = *(char **)((long)&tests[0].name + lVar11);
      pcVar7 = strchr(pcVar4,0x2d);
      pcVar5 = pcVar4;
      if (pcVar7 == pcVar4) {
        pcVar5 = "*";
      }
      bVar2 = anon_unknown.dwarf_ef796::PatternMatchesString(pcVar5,pcVar1);
      if (bVar2) {
        pcVar5 = pcVar7 + 1;
        if (pcVar7 == (char *)0x0) {
          pcVar5 = "";
        }
        bVar2 = anon_unknown.dwarf_ef796::PatternMatchesString(pcVar5,pcVar1);
        bVar2 = !bVar2;
        local_a0 = local_a0 + bVar2;
      }
      else {
        bVar2 = false;
      }
      *(bool *)(lVar11 + 0x1e76d0) = bVar2;
    }
    bVar9 = 1;
    pbVar12 = &tests[0].should_run;
    uVar10 = 0;
    iVar3 = local_9c;
    for (lVar11 = 0; lVar11 < iVar3; lVar11 = lVar11 + 1) {
      if (*pbVar12 == true) {
        uVar10 = uVar10 + 1;
        pTVar8 = (*((RegisteredTest *)(pbVar12 + -0x10))->factory)();
        (anonymous_namespace)::StringPrintf_abi_cxx11_
                  (&local_50,"[%d/%d] %s",(ulong)uVar10,(ulong)local_a0,*(char **)(pbVar12 + -8));
        LinePrinter::Print(&printer,&local_50,ELIDE);
        std::__cxx11::string::~string((string *)&local_50);
        (*pTVar8->_vptr_Test[2])(pTVar8);
        (*pTVar8->_vptr_Test[4])(pTVar8);
        (*pTVar8->_vptr_Test[3])(pTVar8);
        bVar9 = bVar9 & (pTVar8->failed_ ^ 1U);
        (*pTVar8->_vptr_Test[1])(pTVar8);
        iVar3 = ntests;
      }
      pbVar12 = pbVar12 + 0x18;
    }
    pcVar4 = "failed\n";
    if (bVar9 != 0) {
      pcVar4 = "passed\n";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar4,&local_a1);
    LinePrinter::PrintOnNewLine(&printer,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    return (byte)~bVar9 & 1;
  }
LAB_0016fc8b:
  fwrite("usage: ninja_tests [options]\n\noptions:\n  --gtest_filter=POSITIVE_PATTERN[-NEGATIVE_PATTERN]\n      Run tests whose names match the positive but not the negative pattern.\n      \'*\' matches any substring. (gtest\'s \':\', \'?\' are not implemented).\n"
         ,0xf2,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
  int tests_started = 0;

  const char* test_filter = "*";
  if (!ReadFlags(&argc, &argv, &test_filter))
    return 1;

  int nactivetests = 0;
  for (int i = 0; i < ntests; i++)
    if ((tests[i].should_run = TestMatchesFilter(tests[i].name, test_filter)))
      ++nactivetests;

  bool passed = true;
  for (int i = 0; i < ntests; i++) {
    if (!tests[i].should_run) continue;

    ++tests_started;
    testing::Test* test = tests[i].factory();
    printer.Print(
        StringPrintf("[%d/%d] %s", tests_started, nactivetests, tests[i].name),
        LinePrinter::ELIDE);
    test->SetUp();
    test->Run();
    test->TearDown();
    if (test->Failed())
      passed = false;
    delete test;
  }

  printer.PrintOnNewLine(passed ? "passed\n" : "failed\n");
  return passed ? EXIT_SUCCESS : EXIT_FAILURE;
}